

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzSubMod(word *c,word *a,word *b,word *mod,size_t n)

{
  word wVar1;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t in_R8;
  word mask;
  
  wVar1 = zzSub(in_RDI,in_RSI,in_RDX,in_R8);
  zzAddAndW(in_RDI,in_RCX,in_R8,-wVar1);
  return;
}

Assistant:

void SAFE(zzSubMod)(word c[], const word a[], const word b[], const word mod[],
	size_t n)
{
	register word mask = 0;
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	ASSERT(wwIsDisjoint(c, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmp(b, mod, n) < 0);
	// mask <- a < b ? WORD_MAX : WORD_0
	mask = WORD_0 - zzSub(c, a, b, n);
	zzAddAndW(c, mod,  n, mask);
	mask = 0;
}